

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  char *pcVar7;
  byte local_68 [8];
  system_id_t data;
  cpu_raw_data_array_t raw_array;
  int iStack_28;
  uint8_t cpu_type_index;
  int only_clock_queries;
  int writeres;
  int readres;
  int i;
  int parseres;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = parse_cmdline(argc,argv);
  memset(&data.l4_total_instances,0,0x10);
  memset(local_68,0,0x28);
  if (argv_local._4_4_ == 1) {
    if (need_quiet != 0) {
      cpuid_set_warn_function(0);
    }
    cpuid_set_verbosiness_level(verbose_level);
    iVar4 = strcmp(out_file,"");
    if ((iVar4 == 0) || (iVar4 = strcmp(out_file,"-"), iVar4 == 0)) {
      fout = _stdout;
    }
    else {
      fout = (FILE *)fopen(out_file,"wt");
      if ((FILE *)fout == (FILE *)0x0) {
        if (need_quiet == 0) {
          fprintf(_stderr,"Cannot open `%s\' for writing!\n",out_file);
        }
        return -1;
      }
      atexit(close_out);
    }
    pFVar2 = fout;
    if (need_version != 0) {
      uVar6 = cpuid_lib_version();
      fprintf((FILE *)pFVar2,"%s\n",uVar6);
    }
    if (need_input == 0) {
      iVar4 = check_need_raw_data();
      if ((iVar4 != 0) && (iVar4 = cpuid_get_all_raw_data(&data.l4_total_instances), iVar4 < 0)) {
        if (need_quiet == 0) {
          fprintf(_stderr,"Cannot obtain raw CPU data!\n");
          pFVar3 = _stderr;
          uVar6 = cpuid_error();
          fprintf(pFVar3,"Error: %s\n",uVar6);
        }
        return -1;
      }
    }
    else {
      iVar4 = strcmp(raw_data_file,"-");
      if (iVar4 == 0) {
        only_clock_queries = cpuid_deserialize_all_raw_data(&data.l4_total_instances,"");
      }
      else {
        only_clock_queries = cpuid_deserialize_all_raw_data(&data.l4_total_instances,raw_data_file);
      }
      if (only_clock_queries < 0) {
        if (need_quiet == 0) {
          fprintf(_stderr,"Cannot deserialize raw data from ");
          iVar4 = strcmp(raw_data_file,"-");
          if (iVar4 == 0) {
            fprintf(_stderr,"stdin\n");
          }
          else {
            fprintf(_stderr,"file `%s\'\n",raw_data_file);
          }
          pFVar3 = _stderr;
          uVar6 = cpuid_error();
          fprintf(pFVar3,"Error: %s\n",uVar6);
        }
        return -1;
      }
    }
    if (need_output != 0) {
      iVar4 = strcmp(raw_data_file,"-");
      if (iVar4 == 0) {
        iStack_28 = cpuid_serialize_all_raw_data(&data.l4_total_instances,"");
      }
      else {
        iStack_28 = cpuid_serialize_all_raw_data(&data.l4_total_instances,raw_data_file);
      }
      if (iStack_28 < 0) {
        if (need_quiet == 0) {
          fprintf(_stderr,"Cannot serialize raw data to ");
          iVar4 = strcmp(raw_data_file,"-");
          if (iVar4 == 0) {
            fprintf(_stderr,"stdout\n");
          }
          else {
            fprintf(_stderr,"file `%s\'\n",raw_data_file);
          }
          pFVar3 = _stderr;
          uVar6 = cpuid_error();
          fprintf(pFVar3,"Error: %s\n",uVar6);
        }
        return -1;
      }
    }
    if (need_report != 0) {
      if (0 < verbose_level) {
        printf("Writing decoded CPU report to `%s\'\n",out_file);
      }
      iVar4 = cpu_identify_all(&data.l4_total_instances,local_68);
      pFVar2 = fout;
      if (iVar4 < 0) {
        uVar6 = cpuid_error();
        fprintf((FILE *)pFVar2,"Error identifying the CPU: %s\n",uVar6);
      }
      else if (local_68[0] == 0) {
        fprintf((FILE *)fout,"The cpu_types array is empty: there is nothing to report\n");
      }
      else {
        fprintf((FILE *)fout,"CPUID is present\n");
        for (raw_array.raw._3_1_ = 0; raw_array.raw._3_1_ < local_68[0];
            raw_array.raw._3_1_ = raw_array.raw._3_1_ + 1) {
          fprintf((FILE *)fout,"CPU Info for type #%d:\n------------------\n",
                  (ulong)raw_array.raw._3_1_);
          pFVar2 = fout;
          uVar6 = cpu_architecture_str
                            (*(undefined4 *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000));
          fprintf((FILE *)pFVar2,"  arch       : %s\n",uVar6);
          pFVar2 = fout;
          uVar6 = cpu_feature_level_str
                            (*(undefined4 *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 4));
          fprintf((FILE *)pFVar2,"  feat_level : %s\n",uVar6);
          pFVar2 = fout;
          uVar6 = cpu_purpose_str(*(undefined4 *)
                                   (data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x2320));
          fprintf((FILE *)pFVar2,"  purpose    : %s\n",uVar6);
          fprintf((FILE *)fout,"  vendor_str : `%s\'\n",
                  data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 8);
          fprintf((FILE *)fout,"  vendor id  : %d\n",
                  (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x58));
          fprintf((FILE *)fout,"  brand_str  : `%s\'\n",
                  data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x18);
          if (*(int *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000) == 0) {
            fprintf((FILE *)fout,"  family     : %d (%02Xh)\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f0),
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f0));
            fprintf((FILE *)fout,"  model      : %d (%02Xh)\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 500),
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 500));
            fprintf((FILE *)fout,"  stepping   : %d (%02Xh)\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f8),
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f8));
            fprintf((FILE *)fout,"  ext_family : %d (%02Xh)\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1fc),
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1fc));
            fprintf((FILE *)fout,"  ext_model  : %d (%02Xh)\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x200),
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x200));
          }
          else if (*(int *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000) == 1) {
            fprintf((FILE *)fout,"  implementer: %d (%02Xh)\n",
                    (ulong)*(byte *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f0),
                    (ulong)*(byte *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f0));
            fprintf((FILE *)fout,"  variant    : %d (%02Xh)\n",
                    (ulong)*(byte *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f1),
                    (ulong)*(byte *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f1));
            fprintf((FILE *)fout,"  part_num   : %d (%02Xh)\n",
                    (ulong)*(ushort *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f2),
                    (ulong)*(ushort *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x1f2));
            fprintf((FILE *)fout,"  revision   : %d (%02Xh)\n",
                    (ulong)*(byte *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 500),
                    (ulong)*(byte *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 500));
          }
          fprintf((FILE *)fout,"  num_cores  : %d\n",
                  (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x238));
          fprintf((FILE *)fout,"  num_logical: %d\n",
                  (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x23c));
          fprintf((FILE *)fout,"  tot_logical: %d\n",
                  (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x240));
          pFVar2 = fout;
          uVar6 = affinity_mask_str(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 800);
          fprintf((FILE *)pFVar2,"  affi_mask  : 0x%s\n",uVar6);
          if (*(int *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000) == 0) {
            fprintf((FILE *)fout,"  L1 D cache : %d KB\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x244));
            fprintf((FILE *)fout,"  L1 I cache : %d KB\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x248));
            fprintf((FILE *)fout,"  L2 cache   : %d KB\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x24c));
            fprintf((FILE *)fout,"  L3 cache   : %d KB\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x250));
            fprintf((FILE *)fout,"  L4 cache   : %d KB\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x254));
            fprintf((FILE *)fout,"  L1D assoc. : %d-way\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x25c));
            fprintf((FILE *)fout,"  L1I assoc. : %d-way\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x260));
            fprintf((FILE *)fout,"  L2 assoc.  : %d-way\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x264));
            fprintf((FILE *)fout,"  L3 assoc.  : %d-way\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x268));
            fprintf((FILE *)fout,"  L4 assoc.  : %d-way\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x26c));
            fprintf((FILE *)fout,"  L1D line sz: %d bytes\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x274));
            fprintf((FILE *)fout,"  L1I line sz: %d bytes\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x278));
            fprintf((FILE *)fout,"  L2 line sz : %d bytes\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x27c));
            fprintf((FILE *)fout,"  L3 line sz : %d bytes\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x280));
            fprintf((FILE *)fout,"  L4 line sz : %d bytes\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x284));
            fprintf((FILE *)fout,"  L1D inst.  : %d\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x288));
            fprintf((FILE *)fout,"  L1I inst.  : %d\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x28c));
            fprintf((FILE *)fout,"  L2 inst.   : %d\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x290));
            fprintf((FILE *)fout,"  L3 inst.   : %d\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x294));
            fprintf((FILE *)fout,"  L4 inst.   : %d\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x298));
            pcVar7 = "non-authoritative";
            if (*(char *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x2e0) != '\0') {
              pcVar7 = "authoritative";
            }
            fprintf((FILE *)fout,"  SSE units  : %d bits (%s)\n",
                    (ulong)*(uint *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x204),pcVar7)
            ;
          }
          fprintf((FILE *)fout,"  code name  : `%s\'\n",
                  data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x29c);
          fprintf((FILE *)fout,"  features   :");
          for (writeres = 0; pFVar2 = fout, writeres < 0x150; writeres = writeres + 1) {
            if (*(char *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000 + 0x5c + (long)writeres) !=
                '\0') {
              uVar6 = cpu_feature_str(writeres);
              fprintf((FILE *)pFVar2," %s",uVar6);
            }
          }
          fprintf((FILE *)fout,"\n");
        }
      }
      pFVar2 = fout;
      if (need_clockreport != 0) {
        if (need_timed_clockreport == 0) {
          uVar5 = cpu_clock();
          fprintf((FILE *)pFVar2,"  cpu clock  : %d MHz\n",(ulong)uVar5);
        }
        else {
          uVar5 = cpu_clock_measure(400,1);
          fprintf((FILE *)pFVar2,"  cpu clock  : %d MHz\n",(ulong)uVar5);
        }
      }
    }
    bVar1 = true;
    for (writeres = 0; writeres < num_requests; writeres = writeres + 1) {
      if ((requests[writeres] != NEED_CLOCK) && (requests[writeres] != NEED_CLOCK_RDTSC)) {
        bVar1 = false;
        break;
      }
    }
    if ((((need_report == 0) || (!bVar1)) && (0 < num_requests)) || (need_identify != 0)) {
      iVar4 = check_need_raw_data();
      if (iVar4 == 0) {
        for (writeres = 0; writeres < num_requests; writeres = writeres + 1) {
          print_info(requests[writeres],(cpu_id_t *)0x0);
        }
      }
      else {
        iVar4 = cpu_identify_all(&data.l4_total_instances,local_68);
        pFVar3 = _stderr;
        if (iVar4 < 0) {
          if (need_quiet == 0) {
            uVar6 = cpuid_error();
            fprintf(pFVar3,"Error identifying the CPU: %s\n",uVar6);
          }
          return -1;
        }
        for (raw_array.raw._3_1_ = 0; raw_array.raw._3_1_ < local_68[0];
            raw_array.raw._3_1_ = raw_array.raw._3_1_ + 1) {
          if ((((byte)data.l4_total_instances & 1) != 0) && (raw_array.raw._3_1_ != 0)) {
            fprintf((FILE *)fout,
                    "--------------------------------------------------------------------------------\n"
                   );
          }
          for (writeres = 0; writeres < num_requests; writeres = writeres + 1) {
            print_info(requests[writeres],
                       (cpu_id_t *)(data._0_8_ + (ulong)raw_array.raw._3_1_ * 9000));
          }
        }
      }
    }
    if (need_cpulist != 0) {
      print_cpulist();
    }
    if (need_sgx != 0) {
      print_sgx_data((cpu_raw_data_t *)raw_array._0_8_,(cpu_id_t *)data._0_8_);
    }
    if (need_hypervisor != 0) {
      print_hypervisor((cpu_raw_data_t *)raw_array._0_8_,(cpu_id_t *)data._0_8_);
    }
    cpuid_free_raw_data_array(&data.l4_total_instances);
    cpuid_free_system_id(local_68);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
	int parseres = parse_cmdline(argc, argv);
	int i, readres, writeres;
	int only_clock_queries;
	uint8_t cpu_type_index;
	struct cpu_raw_data_array_t raw_array = {
		.with_affinity = false,
		.num_raw       = 0,
		.raw           = NULL
	};
	struct system_id_t data = {
		.num_cpu_types = 0
	};

	if (parseres != 1)
		return parseres;

	/* In quiet mode, disable libcpuid warning messages: */
	if (need_quiet)
		cpuid_set_warn_function(NULL);

	cpuid_set_verbosiness_level(verbose_level);

	/* Redirect output, if necessary: */
	if (strcmp(out_file, "") && strcmp(out_file, "-")) {
		fout = fopen(out_file, "wt");
		if (!fout) {
			if (!need_quiet)
				fprintf(stderr, "Cannot open `%s' for writing!\n", out_file);
			return -1;
		}
		atexit(close_out);
	} else {
		fout = stdout;
	}

	/* If requested, print library version: */
	if (need_version)
		fprintf(fout, "%s\n", cpuid_lib_version());

	if (need_input) {
		/* We have a request to input raw CPUID data from file: */
		if (!strcmp(raw_data_file, "-"))
			/* Input from stdin */
			readres = cpuid_deserialize_all_raw_data(&raw_array, "");
		else
			/* Input from file */
			readres = cpuid_deserialize_all_raw_data(&raw_array, raw_data_file);
		if (readres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot deserialize raw data from ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdin\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	} else {
		if (check_need_raw_data()) {
			/* Try to obtain raw CPUID data from the CPU: */
			readres = cpuid_get_all_raw_data(&raw_array);
			if (readres < 0) {
				if (!need_quiet) {
					fprintf(stderr, "Cannot obtain raw CPU data!\n");
					fprintf(stderr, "Error: %s\n", cpuid_error());
				}
				return -1;
			}
		}
	}

	/* Need to dump raw CPUID data to file: */
	if (need_output) {
		if (!strcmp(raw_data_file, "-"))
			/* Serialize to stdout */
			writeres = cpuid_serialize_all_raw_data(&raw_array, "");
		else
			/* Serialize to file */
			writeres = cpuid_serialize_all_raw_data(&raw_array, raw_data_file);
		if (writeres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot serialize raw data to ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdout\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	}
	if (need_report) {
		if (verbose_level >= 1) {
			printf("Writing decoded CPU report to `%s'\n", out_file);
		}
		/*
		 * Try CPU identification
		 * (this fill the `data' structure with decoded CPU features)
		 */
		if (cpu_identify_all(&raw_array, &data) < 0)
			fprintf(fout, "Error identifying the CPU: %s\n", cpuid_error());
		else if (data.num_cpu_types == 0)
			fprintf(fout, "The cpu_types array is empty: there is nothing to report\n");
		else {
			/* Write a thorough report of cpu_id_t structure to output (usually stdout) */
			fprintf(fout, "CPUID is present\n");
			/* OK, now write what we have in `data'...: */
			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				fprintf(fout, "CPU Info for type #%d:\n------------------\n", cpu_type_index);
				fprintf(fout, "  arch       : %s\n", cpu_architecture_str(data.cpu_types[cpu_type_index].architecture));
				fprintf(fout, "  feat_level : %s\n", cpu_feature_level_str(data.cpu_types[cpu_type_index].feature_level));
				fprintf(fout, "  purpose    : %s\n", cpu_purpose_str(data.cpu_types[cpu_type_index].purpose));
				fprintf(fout, "  vendor_str : `%s'\n", data.cpu_types[cpu_type_index].vendor_str);
				fprintf(fout, "  vendor id  : %d\n", (int) data.cpu_types[cpu_type_index].vendor);
				fprintf(fout, "  brand_str  : `%s'\n", data.cpu_types[cpu_type_index].brand_str);
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  family     : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.family, data.cpu_types[cpu_type_index].x86.family);
					fprintf(fout, "  model      : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.model, data.cpu_types[cpu_type_index].x86.model);
					fprintf(fout, "  stepping   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.stepping, data.cpu_types[cpu_type_index].x86.stepping);
					fprintf(fout, "  ext_family : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_family, data.cpu_types[cpu_type_index].x86.ext_family);
					fprintf(fout, "  ext_model  : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_model, data.cpu_types[cpu_type_index].x86.ext_model);
				}
				else if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_ARM) {
					fprintf(fout, "  implementer: %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.implementer, data.cpu_types[cpu_type_index].arm.implementer);
					fprintf(fout, "  variant    : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.variant, data.cpu_types[cpu_type_index].arm.variant);
					fprintf(fout, "  part_num   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.part_num, data.cpu_types[cpu_type_index].arm.part_num);
					fprintf(fout, "  revision   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.revision, data.cpu_types[cpu_type_index].arm.revision);
				}
				fprintf(fout, "  num_cores  : %d\n", data.cpu_types[cpu_type_index].num_cores);
				fprintf(fout, "  num_logical: %d\n", data.cpu_types[cpu_type_index].num_logical_cpus);
				fprintf(fout, "  tot_logical: %d\n", data.cpu_types[cpu_type_index].total_logical_cpus);
				fprintf(fout, "  affi_mask  : 0x%s\n", affinity_mask_str(&data.cpu_types[cpu_type_index].affinity_mask));
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  L1 D cache : %d KB\n", data.cpu_types[cpu_type_index].l1_data_cache);
					fprintf(fout, "  L1 I cache : %d KB\n", data.cpu_types[cpu_type_index].l1_instruction_cache);
					fprintf(fout, "  L2 cache   : %d KB\n", data.cpu_types[cpu_type_index].l2_cache);
					fprintf(fout, "  L3 cache   : %d KB\n", data.cpu_types[cpu_type_index].l3_cache);
					fprintf(fout, "  L4 cache   : %d KB\n", data.cpu_types[cpu_type_index].l4_cache);
					fprintf(fout, "  L1D assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_data_assoc);
					fprintf(fout, "  L1I assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_instruction_assoc);
					fprintf(fout, "  L2 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l2_assoc);
					fprintf(fout, "  L3 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l3_assoc);
					fprintf(fout, "  L4 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l4_assoc);
					fprintf(fout, "  L1D line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_data_cacheline);
					fprintf(fout, "  L1I line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_instruction_cacheline);
					fprintf(fout, "  L2 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l2_cacheline);
					fprintf(fout, "  L3 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l3_cacheline);
					fprintf(fout, "  L4 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l4_cacheline);
					fprintf(fout, "  L1D inst.  : %d\n", data.cpu_types[cpu_type_index].l1_data_instances);
					fprintf(fout, "  L1I inst.  : %d\n", data.cpu_types[cpu_type_index].l1_instruction_instances);
					fprintf(fout, "  L2 inst.   : %d\n", data.cpu_types[cpu_type_index].l2_instances);
					fprintf(fout, "  L3 inst.   : %d\n", data.cpu_types[cpu_type_index].l3_instances);
					fprintf(fout, "  L4 inst.   : %d\n", data.cpu_types[cpu_type_index].l4_instances);
					fprintf(fout, "  SSE units  : %d bits (%s)\n", data.cpu_types[cpu_type_index].x86.sse_size, data.cpu_types[cpu_type_index].detection_hints[CPU_HINT_SSE_SIZE_AUTH] ? "authoritative" : "non-authoritative");
				}
				fprintf(fout, "  code name  : `%s'\n", data.cpu_types[cpu_type_index].cpu_codename);
				fprintf(fout, "  features   :");
				/*
				* Here we enumerate all CPU feature bits, and when a feature
				* is present output its name:
				*/
				for (i = 0; i < NUM_CPU_FEATURES; i++)
					if (data.cpu_types[cpu_type_index].flags[i])
						fprintf(fout, " %s", cpu_feature_str(i));
				fprintf(fout, "\n");
			}
		}

		/* Is CPU clock info requested? */
		if (need_clockreport) {
			if (need_timed_clockreport) {
				/* Here we use the RDTSC-based routine */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock_measure(400, 1));
			} else {
				/* Here we use the OS-provided info */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock());
			}
		}
	}
	/*
	 * Check if we have any queries to process.
	 * We have to handle the case when `--clock' or `--clock-rdtsc' options
	 * are present.
	 * If in report mode, this will generate spurious output after the
	 * report, if not handled explicitly.
	 */
	only_clock_queries = 1;
	for (i = 0; i < num_requests; i++)
		if (requests[i] != NEED_CLOCK && requests[i] != NEED_CLOCK_RDTSC) {
			only_clock_queries = 0;
			break;
		}
	/* OK, process all queries. */
	if (((!need_report || !only_clock_queries) && num_requests > 0) || need_identify) {
		if (check_need_raw_data()) {
			/* Identify the CPU. Make it do cpuid_get_all_raw_data() itself */
			if (cpu_identify_all(&raw_array, &data) < 0) {
				if (!need_quiet)
					fprintf(stderr,
							"Error identifying the CPU: %s\n",
							cpuid_error());
				return -1;
			}

			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				if (raw_array.with_affinity && (cpu_type_index > 0))
					fprintf(fout, "--------------------------------------------------------------------------------\n");
				for (i = 0; i < num_requests; i++)
					print_info(requests[i], &data.cpu_types[cpu_type_index]);
			}
		}
		else
			for (i = 0; i < num_requests; i++)
				print_info(requests[i], NULL);
	}
	if (need_cpulist) {
		print_cpulist();
	}
	if (need_sgx) {
		print_sgx_data(&raw_array.raw[0], &data.cpu_types[0]);
	}
	if (need_hypervisor) {
		print_hypervisor(&raw_array.raw[0], &data.cpu_types[0]);
	}

	cpuid_free_raw_data_array(&raw_array);
	cpuid_free_system_id(&data);
	return 0;
}